

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

value * __thiscall
mjs::interpreter::impl::make_reference
          (value *__return_storage_ptr__,impl *this,value *obj,value *prop)

{
  long *plVar1;
  gc_heap_ptr_untyped local_60;
  gc_heap_ptr_untyped local_50;
  reference local_40;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
  (**(code **)(*plVar1 + 0x88))(&local_50,plVar1,obj);
  to_string((mjs *)&local_60,this->heap_,prop);
  reference::reference(&local_40,(object_ptr *)&local_50,(string *)&local_60);
  value::value(__return_storage_ptr__,&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_40.property_name_);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_60);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  return __return_storage_ptr__;
}

Assistant:

value make_reference(const value& obj, const value& prop) {
        return value{reference{global_->to_object(obj), to_string(heap_, prop)}};
    }